

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O3

bool __thiscall CPath::create_directory_recursive(CPath *this)

{
  char cVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *__s;
  char *ts;
  path tp;
  char *local_50;
  path local_48;
  
  std::filesystem::__cxx11::path::path(&local_48);
  local_50 = (this->super_path)._M_pathname._M_dataplus._M_p;
  uVar2 = 1;
  if (local_50[*local_50 == '/'] != '\0') {
    __s = local_50 + (*local_50 == '/');
    do {
      pcVar3 = strchr(__s,0x2f);
      if (pcVar3 == (char *)0x0) {
        std::filesystem::__cxx11::path::assign<char*>(&local_48,&local_50);
        cVar1 = std::filesystem::status(&local_48);
        if ((cVar1 == -1) || (cVar1 == '\0')) {
          uVar2 = std::filesystem::create_directory(&local_48);
        }
        break;
      }
      *pcVar3 = '\0';
      std::filesystem::__cxx11::path::assign<char*>(&local_48,&local_50);
      cVar1 = std::filesystem::status(&local_48);
      if (((cVar1 == -1) || (cVar1 == '\0')) &&
         (cVar1 = std::filesystem::create_directory(&local_48), cVar1 == '\0')) {
        uVar2 = 0;
        break;
      }
      *pcVar3 = '/';
      __s = pcVar3 + 1;
    } while (pcVar3[1] != '\0');
  }
  std::filesystem::__cxx11::path::~path(&local_48);
  return (bool)uVar2;
}

Assistant:

bool create_directory_recursive()
	{
		fs::path tp;
		char* ts = const_cast<char*>(c_str());
		char* sep = ts;

		// Пропускаем корневой каталог, если он указан. Его мы не создадим.
		if(*sep == preferred_separator) sep++;

		while(*sep != '\0')
		{
			sep = strchr(sep, preferred_separator);
			if(sep != nullptr)
			{
				*sep = '\0';
				tp.assign(ts);
				if(!fs::exists(tp))
				{
					if(!fs::create_directory(tp))
						return false;
				}

				*sep = preferred_separator;
				sep++;
			}
			else
			{
				tp.assign(ts);
				if(fs::exists(tp))
					return true;

				return fs::create_directory(tp);
			}
		}

		return true;
	}